

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O0

StatusCode __thiscall HttpConn::parseRequesetLine(HttpConn *this,int end_idx)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  long lVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_60;
  int pos;
  iterator beg;
  allocator<char> local_41;
  string local_40 [8];
  string requestLine;
  int end_idx_local;
  HttpConn *this_local;
  
  requestLine.field_2._12_4_ = end_idx;
  pcVar2 = std::vector<char,_std::allocator<char>_>::data(&this->readBuff_);
  pcVar3 = std::vector<char,_std::allocator<char>_>::data(&this->readBuff_);
  lVar4 = (long)(int)requestLine.field_2._12_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char*,void>(local_40,pcVar2,pcVar3 + lVar4,&local_41);
  std::allocator<char>::~allocator(&local_41);
  _Stack_60._M_current = (char *)std::__cxx11::string::begin();
  iVar1 = std::__cxx11::string::find((char *)local_40,0x175b64);
  if (iVar1 < 0) {
    iVar1 = std::__cxx11::string::find((char *)local_40,0x175b68);
    if (iVar1 < 0) {
      iVar1 = std::__cxx11::string::find((char *)local_40,0x175b6d);
      if (iVar1 < 0) {
        this_local._4_4_ = BadRequest;
        goto LAB_00157e27;
      }
      this->method_ = Post;
      this->checked_idx_ = this->checked_idx_ + 5;
    }
    else {
      this->method_ = Head;
      this->checked_idx_ = this->checked_idx_ + 5;
    }
  }
  else {
    this->method_ = Get;
    this->checked_idx_ = this->checked_idx_ + 4;
  }
  iVar1 = std::__cxx11::string::find((char)local_40,0x20);
  if (iVar1 < 0) {
    this_local._4_4_ = BadRequest;
  }
  else {
    __first = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator+(&stack0xffffffffffffffa0,(long)this->checked_idx_);
    __last = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&stack0xffffffffffffffa0,(long)iVar1);
    std::__cxx11::string::assign<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((string *)&this->path_,__first,__last);
    this->checked_idx_ = iVar1 + 1;
    lVar4 = std::__cxx11::string::size();
    if (lVar4 - this->checked_idx_ == 8) {
      std::__cxx11::string::find((char *)local_40,0x175b72);
      pcVar2 = (char *)std::__cxx11::string::back();
      if (*pcVar2 == '1') {
        this->version_ = Http11;
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::back();
        if (*pcVar2 != '0') {
          this_local._4_4_ = BadRequest;
          goto LAB_00157e27;
        }
        this->version_ = Http11;
      }
      iVar1 = std::__cxx11::string::size();
      this->checked_idx_ = iVar1 + 2;
      this_local._4_4_ = OK;
    }
    else {
      this_local._4_4_ = BadRequest;
    }
  }
LAB_00157e27:
  std::__cxx11::string::~string(local_40);
  return this_local._4_4_;
}

Assistant:

HttpConn::StatusCode HttpConn::parseRequesetLine(int end_idx) {
    std::string requestLine(readBuff_.data(), readBuff_.data() + end_idx);
    auto beg = requestLine.begin();
    int pos;
    do {
        pos = requestLine.find("GET");
        if (pos >= 0) {
            method_ = Get;
            checked_idx_ += 4;
            break;
        }
        pos = requestLine.find("HEAD");
        if (pos >= 0) {
            method_ = Head;
            checked_idx_ += 5;
            break;
        }
        pos = requestLine.find("POST");
        if (pos >= 0) {
            method_ = Post;
            checked_idx_ += 5;
            break;
        }
        //加入其他方法
        return BadRequest;
    } while (false);
    
    pos = requestLine.find(' ', checked_idx_);
    if (pos < 0) {
        return BadRequest;
    } else {
        path_.assign(beg + checked_idx_, beg + pos);
        checked_idx_ = pos + 1;
    }
   
    if ((requestLine.size() - checked_idx_) != 8 || requestLine.find("HTTP/1.", checked_idx_) < 0) {
        return BadRequest;
    } else if (requestLine.back() == '1') {
        version_ = Http11;
    } else if (requestLine.back() == '0') {
        version_ = Http11;
    } else 
        return BadRequest;
    
    checked_idx_ = requestLine.size() + 2;
    return OK;
}